

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall Shop::printSale(Shop *this,Sale *sale)

{
  ostream *poVar1;
  Medicine medicine;
  undefined1 auStack_a8 [48];
  string local_78 [96];
  
  poVar1 = std::operator<<((ostream *)&std::cout,"ID");
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = std::operator<<(poVar1,"Customer Name");
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = std::operator<<(poVar1,"Medicine Name");
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = std::operator<<(poVar1,"Medicine Company");
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = std::operator<<(poVar1,"Quantity");
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = std::operator<<(poVar1,"Unit Price");
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = std::operator<<(poVar1,"Total Amount");
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = std::operator<<(poVar1,"Date");
  std::endl<char,std::char_traits<char>>(poVar1);
  Medicine::Medicine((Medicine *)auStack_a8,&sale->medicine);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,sale->id);
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = std::operator<<(poVar1,(string *)&sale->customerName);
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = std::operator<<(poVar1,(string *)(auStack_a8 + 0x10));
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = std::operator<<(poVar1,local_78);
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sale->quantity);
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,auStack_a8._4_4_);
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sale->quantity * (sale->medicine).unitePrice);
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = std::operator<<(poVar1,(string *)&sale->date);
  std::endl<char,std::char_traits<char>>(poVar1);
  Medicine::~Medicine((Medicine *)auStack_a8);
  return;
}

Assistant:

void printSale(Sale sale) {
        cout << "ID" << "\t" << "Customer Name" << "\t" << "Medicine Name" << "\t" << "Medicine Company" << "\t"
             << "Quantity" << "\t" << "Unit Price" << "\t" << "Total Amount" << "\t" << "Date" << endl;
        Medicine medicine = sale.medicine;
        cout << sale.id << "\t" << sale.customerName << "\t" << medicine.getName() << "\t" << medicine.getCompanyName()
             << "\t" << sale.quantity << "\t" << medicine.unitePrice << "\t" << sale.getTotalAmount() << "\t"
             << sale.getDate() << endl;
    }